

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<unsigned_long> __thiscall
capnp::compiler::Compiler::lookup(Compiler *this,uint64_t parent,StringPtr childName)

{
  Mutex *this_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar1;
  
  this_00 = (Mutex *)(parent + 8);
  kj::_::Mutex::lock(this_00,0);
  MVar2 = Impl::lookup((Impl *)this,*(uint64_t *)(parent + 0x28),childName);
  aVar1 = MVar2.ptr.field_1;
  if (this_00 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
    aVar1 = extraout_RDX;
  }
  MVar2.ptr.field_1.value = aVar1.value;
  MVar2.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar2.ptr;
}

Assistant:

kj::Maybe<uint64_t> Compiler::lookup(uint64_t parent, kj::StringPtr childName) const {
  return impl.lockExclusive()->get()->lookup(parent, childName);
}